

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

bool __thiscall
__gnu_cxx::__ops::
_Iter_comp_val<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/Filesystem.cc:664:15)>
::anon_class_1_0_00000001_for__M_comp::operator()
          (anon_class_1_0_00000001_for__M_comp *this,pollfd *x,pollfd *y)

{
  pollfd *y_local;
  pollfd *x_local;
  anon_class_1_0_00000001_for__M_comp *this_local;
  
  return x->fd < y->fd;
}

Assistant:

void Poll::remove(int fd, bool close_fd) {
  auto pred = [](const struct pollfd& x, const struct pollfd& y) {
    return x.fd < y.fd;
  };

  struct pollfd pfd;
  pfd.fd = fd;
  auto erase_it = lower_bound(this->poll_fds.begin(), this->poll_fds.end(),
      pfd, pred);
  if (erase_it != this->poll_fds.end() && erase_it->fd == fd) {
    this->poll_fds.erase(erase_it);
    if (close_fd) {
      close(fd);
    }
  }
}